

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNCollider<4>::collide_recurse_entry
          (BVHNCollider<4> *this,NodeRef ref0,BBox3fa *bounds0,NodeRef ref1,BBox3fa *bounds1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BBox3fa *pBVar3;
  Vec3fa *pVVar4;
  size_t *psVar5;
  size_t sVar6;
  unsigned_long last;
  uint uVar7;
  undefined8 uVar8;
  void *ptr;
  uint uVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  CollideJob *pCVar13;
  runtime_error *this_00;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  size_t sVar17;
  ulong uVar18;
  CollideJob *pCVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  task_group_context context;
  undefined1 *puStack_1d0;
  auto_partitioner local_1c1;
  uint local_1c0;
  uint local_1bc;
  jobvector local_1b8;
  ulong local_190;
  ulong uStack_188;
  void *local_180;
  uint local_174;
  BVHNCollider<4> *local_170;
  undefined8 local_168;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  long local_120;
  size_t local_118;
  anon_class_24_3_c7c30120 local_110;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  anon_class_8_1_898bcfc2_conflict12 local_c0;
  task_group_context local_b8;
  
  local_1b8.size_active = 0;
  local_1b8.size_alloced = 0;
  local_1b8.items = (CollideJob *)0x0;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = (void *)0x0;
  puStack_1d0 = (undefined1 *)0xba3514;
  local_170 = this;
  local_1b8.items = (CollideJob *)alignedMalloc(0x38000,0x10);
  puStack_1d0 = (undefined1 *)0xba3520;
  alignedFree((void *)0x0);
  ptr = local_180;
  uVar12 = local_190;
  local_1b8.size_active = 0;
  local_1b8.size_alloced = 0x800;
  if (uStack_188 < 0x800) {
    puStack_1d0 = (undefined1 *)0xba355a;
    local_180 = alignedMalloc(0x38000,0x10);
    if (local_190 != 0) {
      lVar11 = 0x60;
      uVar14 = 0;
      do {
        *(undefined8 *)((long)local_180 + lVar11 + -0x60) =
             *(undefined8 *)((long)ptr + lVar11 + -0x60);
        puVar1 = (undefined8 *)((long)ptr + lVar11 + -0x50);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_180 + lVar11 + -0x50);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)ptr + lVar11 + -0x40);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_180 + lVar11 + -0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)ptr + lVar11 + -0x30);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_180 + lVar11 + -0x30);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)ptr + lVar11 + -0x20);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_180 + lVar11 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)ptr + lVar11 + -0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)local_180 + lVar11 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(undefined8 *)((long)local_180 + lVar11) = *(undefined8 *)((long)ptr + lVar11);
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x70;
      } while (uVar14 < local_190);
    }
    puStack_1d0 = (undefined1 *)0xba35ce;
    alignedFree(ptr);
    local_190 = uVar12;
    uStack_188 = 0x800;
  }
  pCVar19 = local_1b8.items;
  sVar6 = local_1b8.size_active;
  fVar28 = (bounds0->lower).field_0.m128[0];
  fVar30 = (bounds0->lower).field_0.m128[1];
  fVar32 = (bounds0->lower).field_0.m128[2];
  fVar34 = (bounds0->lower).field_0.m128[3];
  fVar35 = (bounds0->upper).field_0.m128[0];
  fVar36 = (bounds0->upper).field_0.m128[1];
  fVar37 = (bounds0->upper).field_0.m128[2];
  fVar38 = (bounds0->upper).field_0.m128[3];
  fVar23 = (bounds1->lower).field_0.m128[0];
  fVar24 = (bounds1->lower).field_0.m128[1];
  fVar25 = (bounds1->lower).field_0.m128[2];
  fVar26 = (bounds1->lower).field_0.m128[3];
  fVar27 = (bounds1->upper).field_0.m128[0];
  fVar29 = (bounds1->upper).field_0.m128[1];
  fVar31 = (bounds1->upper).field_0.m128[2];
  fVar33 = (bounds1->upper).field_0.m128[3];
  uVar12 = local_1b8.size_active + 1;
  if (local_1b8.size_alloced < uVar12) {
    uVar14 = uVar12;
    uVar15 = local_1b8.size_alloced;
    if (local_1b8.size_alloced != 0) {
      do {
        uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
        uVar15 = uVar14;
      } while (uVar14 < uVar12);
    }
    if (local_1b8.size_alloced != uVar14) {
      puStack_1d0 = (undefined1 *)0xba3662;
      local_168 = *(size_t **)&(bounds1->lower).field_0;
      fStack_160 = fVar25;
      fStack_15c = fVar26;
      local_158 = fVar35;
      fStack_154 = fVar36;
      fStack_150 = fVar37;
      fStack_14c = fVar38;
      local_148 = *(size_t *)&(bounds0->lower).field_0;
      fStack_140 = fVar32;
      fStack_13c = fVar34;
      local_138 = *(CollideJob ***)&(bounds1->upper).field_0;
      fStack_130 = fVar31;
      fStack_12c = fVar33;
      local_1b8.items = (CollideJob *)alignedMalloc(uVar14 * 0x70,0x10);
      if (local_1b8.size_active != 0) {
        lVar11 = 0x60;
        uVar15 = 0;
        do {
          *(undefined8 *)((long)local_1b8.items + lVar11 + -0x60) =
               *(undefined8 *)((long)pCVar19 + lVar11 + -0x60);
          puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x50);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)local_1b8.items + lVar11 + -0x50);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x40);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)local_1b8.items + lVar11 + -0x40);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x30);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)local_1b8.items + lVar11 + -0x30);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x20);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)local_1b8.items + lVar11 + -0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x10);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)local_1b8.items + lVar11 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          *(undefined8 *)((long)&((local_1b8.items)->ref0).ptr + lVar11) =
               *(undefined8 *)((long)&(pCVar19->ref0).ptr + lVar11);
          uVar15 = uVar15 + 1;
          lVar11 = lVar11 + 0x70;
        } while (uVar15 < local_1b8.size_active);
      }
      puStack_1d0 = (undefined1 *)0xba36da;
      alignedFree(pCVar19);
      local_1b8.size_alloced = uVar14;
      fVar23 = (float)local_168;
      fVar24 = local_168._4_4_;
      fVar25 = fStack_160;
      fVar26 = fStack_15c;
      fVar27 = (float)local_138;
      fVar29 = local_138._4_4_;
      fVar31 = fStack_130;
      fVar33 = fStack_12c;
      fVar28 = (float)local_148;
      fVar30 = local_148._4_4_;
      fVar32 = fStack_140;
      fVar34 = fStack_13c;
      fVar35 = local_158;
      fVar36 = fStack_154;
      fVar37 = fStack_150;
      fVar38 = fStack_14c;
    }
  }
  local_1b8.size_active = uVar12;
  local_1b8.items[sVar6].ref0.ptr = ref0.ptr;
  pBVar3 = &local_1b8.items[sVar6].bounds0;
  (pBVar3->lower).field_0.m128[0] = fVar28;
  (pBVar3->lower).field_0.m128[1] = fVar30;
  (pBVar3->lower).field_0.m128[2] = fVar32;
  (pBVar3->lower).field_0.m128[3] = fVar34;
  pBVar3 = &local_1b8.items[sVar6].bounds0;
  (pBVar3->upper).field_0.m128[0] = fVar35;
  (pBVar3->upper).field_0.m128[1] = fVar36;
  (pBVar3->upper).field_0.m128[2] = fVar37;
  (pBVar3->upper).field_0.m128[3] = fVar38;
  uVar12 = 0;
  local_1b8.items[sVar6].depth0 = 0;
  local_1b8.items[sVar6].ref1.ptr = ref1.ptr;
  pBVar3 = &local_1b8.items[sVar6].bounds1;
  (pBVar3->lower).field_0.m128[0] = fVar23;
  (pBVar3->lower).field_0.m128[1] = fVar24;
  (pBVar3->lower).field_0.m128[2] = fVar25;
  (pBVar3->lower).field_0.m128[3] = fVar26;
  pBVar3 = &local_1b8.items[sVar6].bounds1;
  (pBVar3->upper).field_0.m128[0] = fVar27;
  (pBVar3->upper).field_0.m128[1] = fVar29;
  (pBVar3->upper).field_0.m128[2] = fVar31;
  (pBVar3->upper).field_0.m128[3] = fVar33;
  local_1b8.items[sVar6].depth1 = 0;
  local_1bc = 0;
  if (sVar6 + 9 < 0x801) {
    uVar16 = 1;
    do {
      local_168 = &(&local_1b8)[uVar12].size_active;
      uVar14 = (&local_1b8)[uVar12].size_active;
      uVar15 = (ulong)uVar16;
      if (uVar14 == 0) {
        uVar9 = (uint)uVar12;
        uVar7 = uVar16;
        lVar11 = uVar15 * 0x20;
        if ((&local_1b8)[uVar15].size_active == 0) break;
      }
      else {
        local_174 = uVar16;
        local_120 = uVar15 * 0x20;
        local_138 = &(&local_1b8)[uVar12].items;
        uVar18 = 0;
        local_1c0 = (uint)uVar12;
        do {
          pCVar19 = *local_138 + uVar18;
          sVar6 = (&local_1b8)[uVar15].size_active;
          if (((uVar14 - uVar18) + sVar6) - 0x7f9 < 0xfffffffffffff7ff) {
            sVar17 = (pCVar19->ref0).ptr;
            fVar28 = (pCVar19->bounds0).lower.field_0.m128[0];
            fVar30 = (pCVar19->bounds0).lower.field_0.m128[1];
            fVar32 = (pCVar19->bounds0).lower.field_0.m128[2];
            fVar34 = (pCVar19->bounds0).lower.field_0.m128[3];
            fVar35 = (pCVar19->bounds0).upper.field_0.m128[0];
            fVar36 = (pCVar19->bounds0).upper.field_0.m128[1];
            fVar37 = (pCVar19->bounds0).upper.field_0.m128[2];
            fVar38 = (pCVar19->bounds0).upper.field_0.m128[3];
            local_b8.my_cpu_ctl_env = pCVar19->depth0;
            local_b8._8_8_ = (pCVar19->ref1).ptr;
            fVar23 = (pCVar19->bounds1).lower.field_0.m128[0];
            fVar24 = (pCVar19->bounds1).lower.field_0.m128[1];
            fVar25 = (pCVar19->bounds1).lower.field_0.m128[2];
            fVar26 = (pCVar19->bounds1).lower.field_0.m128[3];
            fVar27 = (pCVar19->bounds1).upper.field_0.m128[0];
            fVar29 = (pCVar19->bounds1).upper.field_0.m128[1];
            fVar31 = (pCVar19->bounds1).upper.field_0.m128[2];
            fVar33 = (pCVar19->bounds1).upper.field_0.m128[3];
            sVar20 = pCVar19->depth1;
            uVar12 = sVar6 + 1;
            uVar14 = (&local_1b8)[uVar15].size_alloced;
            if (uVar14 < uVar12) {
              uVar22 = uVar12;
              uVar21 = uVar14;
              if (uVar14 != 0) {
                do {
                  uVar22 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
                  uVar21 = uVar22;
                } while (uVar22 < uVar12);
              }
              if (uVar14 != uVar22) {
                local_118 = sVar20;
                local_f8 = fVar27;
                fStack_f4 = fVar29;
                fStack_f0 = fVar31;
                fStack_ec = fVar33;
                local_e8 = fVar23;
                fStack_e4 = fVar24;
                fStack_e0 = fVar25;
                fStack_dc = fVar26;
                local_d8 = fVar35;
                fStack_d4 = fVar36;
                fStack_d0 = fVar37;
                fStack_cc = fVar38;
                local_158 = fVar28;
                fStack_154 = fVar30;
                fStack_150 = fVar32;
                fStack_14c = fVar34;
                local_148 = sVar17;
                pCVar19 = (&local_1b8)[uVar15].items;
                puStack_1d0 = (undefined1 *)0xba3867;
                pCVar13 = (CollideJob *)alignedMalloc(uVar22 * 0x70,0x10);
                (&local_1b8)[uVar15].items = pCVar13;
                if ((&local_1b8)[uVar15].size_active != 0) {
                  lVar11 = 0x60;
                  uVar14 = 0;
                  do {
                    pCVar13 = (&local_1b8)[uVar15].items;
                    *(undefined8 *)((long)pCVar13 + lVar11 + -0x60) =
                         *(undefined8 *)((long)pCVar19 + lVar11 + -0x60);
                    puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x50);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pCVar13 + lVar11 + -0x50);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x40);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pCVar13 + lVar11 + -0x40);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x30);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pCVar13 + lVar11 + -0x30);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x20);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pCVar13 + lVar11 + -0x20);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    puVar1 = (undefined8 *)((long)pCVar19 + lVar11 + -0x10);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pCVar13 + lVar11 + -0x10);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    *(undefined8 *)((long)&(pCVar13->ref0).ptr + lVar11) =
                         *(undefined8 *)((long)&(pCVar19->ref0).ptr + lVar11);
                    uVar14 = uVar14 + 1;
                    lVar11 = lVar11 + 0x70;
                  } while (uVar14 < (&local_1b8)[uVar15].size_active);
                }
                puStack_1d0 = (undefined1 *)0xba38db;
                alignedFree(pCVar19);
                (&local_1b8)[uVar15].size_alloced = uVar22;
                sVar17 = local_148;
                sVar20 = local_118;
                fVar28 = local_158;
                fVar30 = fStack_154;
                fVar32 = fStack_150;
                fVar34 = fStack_14c;
                fVar35 = local_d8;
                fVar36 = fStack_d4;
                fVar37 = fStack_d0;
                fVar38 = fStack_cc;
                fVar23 = local_e8;
                fVar24 = fStack_e4;
                fVar25 = fStack_e0;
                fVar26 = fStack_dc;
                fVar27 = local_f8;
                fVar29 = fStack_f4;
                fVar31 = fStack_f0;
                fVar33 = fStack_ec;
              }
            }
            pCVar19 = (&local_1b8)[uVar15].items;
            (&local_1b8)[uVar15].size_active = uVar12;
            pCVar19[sVar6].ref0.ptr = sVar17;
            pBVar3 = &pCVar19[sVar6].bounds0;
            (pBVar3->lower).field_0.m128[0] = fVar28;
            (pBVar3->lower).field_0.m128[1] = fVar30;
            (pBVar3->lower).field_0.m128[2] = fVar32;
            (pBVar3->lower).field_0.m128[3] = fVar34;
            pVVar4 = &pCVar19[sVar6].bounds0.upper;
            (pVVar4->field_0).m128[0] = fVar35;
            (pVVar4->field_0).m128[1] = fVar36;
            (pVVar4->field_0).m128[2] = fVar37;
            (pVVar4->field_0).m128[3] = fVar38;
            psVar5 = &pCVar19[sVar6].depth0;
            *(undefined4 *)psVar5 = (undefined4)local_b8.my_cpu_ctl_env;
            *(undefined4 *)((long)psVar5 + 4) = local_b8.my_cpu_ctl_env._4_4_;
            *(__atomic_base<unsigned_int> *)&((NodeRef *)(psVar5 + 1))->ptr =
                 local_b8.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i;
            *(undefined4 *)((long)psVar5 + 0xc) = local_b8._12_4_;
            pBVar3 = &pCVar19[sVar6].bounds1;
            (pBVar3->lower).field_0.m128[0] = fVar23;
            (pBVar3->lower).field_0.m128[1] = fVar24;
            (pBVar3->lower).field_0.m128[2] = fVar25;
            (pBVar3->lower).field_0.m128[3] = fVar26;
            pVVar4 = &pCVar19[sVar6].bounds1.upper;
            (pVVar4->field_0).m128[0] = fVar27;
            (pVVar4->field_0).m128[1] = fVar29;
            (pVVar4->field_0).m128[2] = fVar31;
            (pVVar4->field_0).m128[3] = fVar33;
            pCVar19[sVar6].depth1 = sVar20;
          }
          else {
            puStack_1d0 = (undefined1 *)0xba3951;
            split(local_170,pCVar19,&local_1b8 + uVar15);
          }
          uVar18 = uVar18 + 1;
          uVar14 = *local_168;
        } while (uVar18 < uVar14);
        uVar9 = local_1c0;
        uVar7 = local_174;
        lVar11 = local_120;
        if (*(ulong *)((long)&local_1b8.size_active + local_120) == uVar14) {
          uVar12 = (ulong)local_1c0;
          break;
        }
      }
      uVar16 = uVar9;
      uVar12 = (ulong)uVar7;
      *local_168 = 0;
      local_1bc = uVar7;
    } while (*(long *)((long)&local_1b8.size_active + lVar11) + 8U < 0x801);
  }
  last = (&local_1b8)[uVar12].size_active;
  local_110.jobs = (jobvector (*) [2])&local_1b8;
  local_110.source = (int *)&local_1bc;
  local_110.this = local_170;
  local_b8._12_2_ = 0x401;
  local_b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b8.my_name = CUSTOM_CTX;
  puStack_1d0 = (undefined1 *)0xba3a1e;
  tbb::detail::r1::initialize(&local_b8);
  local_c0.func = &local_110;
  puStack_1d0 = (undefined1 *)0xba3a4d;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for<unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_>(unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,tbb::detail::d1::auto_partitioner_const>
            (0,last,1,&local_c0,&local_1c1,&local_b8);
  puStack_1d0 = (undefined1 *)0xba3a5a;
  cVar10 = tbb::detail::r1::is_group_execution_cancelled(&local_b8);
  if (cVar10 != '\0') {
    puStack_1d0 = (undefined1 *)0xba3aad;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puStack_1d0 = (undefined1 *)0xba3abf;
    std::runtime_error::runtime_error(this_00,"task cancelled");
    puStack_1d0 = &LAB_00ba3ad5;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puStack_1d0 = (undefined1 *)0xba3a6b;
  tbb::detail::r1::destroy(&local_b8);
  lVar11 = 0x40;
  do {
    puStack_1d0 = (undefined1 *)0xba3a7a;
    alignedFree(*(void **)((long)&local_1c0 + lVar11));
    *(undefined8 *)((long)&puStack_1d0 + lVar11) = 0;
    *(undefined8 *)(&stack0xfffffffffffffe38 + lVar11) = 0;
    *(undefined8 *)((long)&local_1c0 + lVar11) = 0;
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != 0);
  return;
}

Assistant:

void BVHNCollider<N>::collide_recurse_entry(NodeRef ref0, const BBox3fa& bounds0, NodeRef ref1, const BBox3fa& bounds1)
    {
      CSTAT(bvh_collide_traversal_steps = 0);
      CSTAT(bvh_collide_leaf_pairs = 0);
      CSTAT(bvh_collide_leaf_iterations = 0);
      CSTAT(bvh_collide_prim_intersections1 = 0);
      CSTAT(bvh_collide_prim_intersections2 = 0);
      CSTAT(bvh_collide_prim_intersections3 = 0);
      CSTAT(bvh_collide_prim_intersections4 = 0);
      CSTAT(bvh_collide_prim_intersections5 = 0);
      CSTAT(bvh_collide_prim_intersections = 0);
#if 0
      collide_recurse(ref0,bounds0,ref1,bounds1,0,0);
#else
      const int M = 2048;
      jobvector jobs[2];
      jobs[0].reserve(M);
      jobs[1].reserve(M);
      jobs[0].push_back(CollideJob(ref0,bounds0,0,ref1,bounds1,0));
      int source = 0;
      int target = 1;

      /* try to split job until job list is full */
      while (jobs[source].size()+8 <= M)
      {
        for (size_t i=0; i<jobs[source].size(); i++)
        {
          const CollideJob& job = jobs[source][i];
          size_t remaining = jobs[source].size()-i;
          if (jobs[target].size()+remaining+8 > M) {
            jobs[target].push_back(job);
          } else {
            split(job,jobs[target]);
          }
        }

        /* stop splitting jobs if we reached only leaves and cannot make progress anymore */
        if (jobs[target].size() == jobs[source].size())
          break;

        jobs[source].resize(0);
        std::swap(source,target);
      }

      /* parallel processing of all jobs */
      parallel_for(size_t(jobs[source].size()), [&] ( size_t i ) {
          CollideJob& j = jobs[source][i];
          collide_recurse(j.ref0,j.bounds0,j.ref1,j.bounds1,j.depth0,j.depth1);
        });
      
      
#endif
      CSTAT(PRINT(bvh_collide_traversal_steps));
      CSTAT(PRINT(bvh_collide_leaf_pairs));
      CSTAT(PRINT(bvh_collide_leaf_iterations));
      CSTAT(PRINT(bvh_collide_prim_intersections1));
      CSTAT(PRINT(bvh_collide_prim_intersections2));
      CSTAT(PRINT(bvh_collide_prim_intersections3));
      CSTAT(PRINT(bvh_collide_prim_intersections4));
      CSTAT(PRINT(bvh_collide_prim_intersections5));
      CSTAT(PRINT(bvh_collide_prim_intersections));
    }